

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_setup_dst_planes
               (macroblockd_plane *planes,BLOCK_SIZE bsize,YV12_BUFFER_CONFIG *src,int mi_row,
               int mi_col,int plane_start,int plane_end)

{
  long lVar1;
  undefined8 in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int is_uv;
  macroblockd_plane *pd;
  int i;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff94;
  BLOCK_SIZE in_stack_ffffffffffffff9f;
  buf_2d *in_stack_ffffffffffffffa0;
  undefined4 local_54;
  int iVar2;
  
  iVar2 = in_R9D;
  while( true ) {
    if (in_stack_00000008 < 3) {
      local_54 = in_stack_00000008;
    }
    else {
      local_54 = 3;
    }
    if (local_54 <= in_R9D) break;
    lVar1 = in_RDI + (long)in_R9D * 0xa30;
    setup_pred_plane(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,*(undefined4 *)(lVar1 + 4)),0,0,
                     in_stack_ffffffffffffff84,in_R9D,(int)lVar1,
                     (scale_factors *)CONCAT44(iVar2,in_R9D),in_R8D,(int)in_RDX);
    in_R9D = in_R9D + 1;
  }
  return;
}

Assistant:

void av1_setup_dst_planes(struct macroblockd_plane *planes, BLOCK_SIZE bsize,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const int plane_start, const int plane_end) {
  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = plane_start; i < AOMMIN(plane_end, MAX_MB_PLANE); ++i) {
    struct macroblockd_plane *const pd = &planes[i];
    const int is_uv = i > 0;
    setup_pred_plane(&pd->dst, bsize, src->buffers[i], src->crop_widths[is_uv],
                     src->crop_heights[is_uv], src->strides[is_uv], mi_row,
                     mi_col, NULL, pd->subsampling_x, pd->subsampling_y);
  }
}